

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwriteinitialization.cpp
# Opt level: O3

void CPP::WriteInitialization::addQtFlagsInitializer
               (Item *item,DomPropertyMap *properties,QString *name,int column)

{
  DomProperty *pDVar1;
  Node<QString,_DomProperty_*> *pNVar2;
  long in_FS_OFFSET;
  QString local_b8;
  QStringBuilder<QString_&,_QString_&> local_98;
  QString local_88;
  QArrayData *local_70;
  QString *local_68;
  long local_60;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (properties->d != (Data<QHashPrivate::Node<QString,_DomProperty_*>_> *)0x0) {
    pNVar2 = QHashPrivate::Data<QHashPrivate::Node<QString,_DomProperty_*>_>::findNode<QString>
                       (properties->d,name);
    if ((pNVar2 != (Node<QString,_DomProperty_*> *)0x0) &&
       (pDVar1 = pNVar2->value, pDVar1 != (DomProperty *)0x0)) {
      local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      local_70 = (QArrayData *)CONCAT62(local_70._2_6_,L'|');
      local_68 = (QString *)&language::qtQualifier;
      QStringBuilder<char16_t,_QString_&>::convertTo<QString>
                (&local_58,(QStringBuilder<char16_t,_QString_&> *)&local_70);
      local_70 = &((pDVar1->m_set).d.d)->super_QArrayData;
      local_68 = (QString *)(pDVar1->m_set).d.ptr;
      local_60 = (pDVar1->m_set).d.size;
      if (local_70 != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)&local_70->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
             (((QArrayData *)&local_70->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      if (local_60 != 0) {
        QString::replace((QChar)(char16_t)(QStringBuilder<char16_t,_QString_&> *)&local_70,
                         (QString *)0x7c,(CaseSensitivity)&local_58);
        local_98.a = (QString *)&language::qtQualifier;
        local_98.b = (QString *)&local_70;
        QStringBuilder<QString_&,_QString_&>::convertTo<QString>(&local_88,&local_98);
        local_b8.d.d = (Data *)0x0;
        local_b8.d.ptr = (char16_t *)0x0;
        local_b8.d.size = 0;
        addInitializer(item,name,column,&local_88,&local_b8,false);
        if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      if (local_70 != (QArrayData *)0x0) {
        LOCK();
        (local_70->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_70->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_70->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_70,2,0x10);
        }
      }
      if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void WriteInitialization::addQtFlagsInitializer(Item *item, const DomPropertyMap &properties,
                                                const QString &name, int column)
{
    if (const DomProperty *p = properties.value(name)) {
        const QString orOperator = u'|' + language::qtQualifier;
        QString v = p->elementSet();
        if (!v.isEmpty()) {
            v.replace(u'|', orOperator);
            addInitializer(item, name, column, language::qtQualifier + v);
        }
    }
}